

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cc
# Opt level: O2

void board::Board::INIT(void)

{
  uint uVar1;
  unsigned_long uVar2;
  result_type rVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int rank;
  ulong uVar12;
  uint64_t uVar13;
  uniform_int_distribution<unsigned_long> dist;
  mt19937_64 e2;
  random_device rd;
  
  std::random_device::random_device(&rd);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed(&e2,(ulong)uVar1);
  uVar2 = llround(2.305843009213694e+18);
  dist._M_param._M_b = llround(4.611686018427388e+18);
  lVar5 = 0;
  dist._M_param._M_a = uVar2;
  while (lVar9 = lVar5, lVar9 != 0x30c0) {
    for (lVar10 = 0; lVar5 = lVar9 + 0x3c0, lVar10 != 0x3c0; lVar10 = lVar10 + 8) {
      rVar3 = std::uniform_int_distribution<unsigned_long>::operator()(&dist,&e2);
      *(result_type *)((long)PIECE_KEYS[0] + lVar9 + lVar10) = rVar3;
    }
  }
  rVar3 = std::uniform_int_distribution<unsigned_long>::operator()(&dist,&e2);
  for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 8) {
    *(result_type *)((long)CASTLE_KEYS + lVar5) = rVar3;
  }
  SIDE_KEY = std::uniform_int_distribution<unsigned_long>::operator()(&dist,&e2);
  for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 8) {
    *(undefined8 *)((long)FILE_MASK + lVar5) = 0;
    *(undefined8 *)((long)RANK_MASK + lVar5) = 0;
  }
  for (lVar5 = 0; lVar5 != 0x200; lVar5 = lVar5 + 8) {
    *(undefined8 *)((long)PASSED_PAWN_MASK[0] + lVar5) = 0;
    *(undefined8 *)((long)PASSED_PAWN_MASK[1] + lVar5) = 0;
    *(undefined8 *)((long)ISOLATED_PAWN_MASK + lVar5) = 0;
  }
  uVar11 = 0;
  for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
    uVar13 = RANK_MASK[lVar5];
    uVar6 = uVar11;
    for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 8) {
      *(ulong *)((long)FILE_MASK + lVar9) =
           *(ulong *)((long)FILE_MASK + lVar9) | 1L << ((byte)uVar6 & 0x3f);
      uVar13 = uVar13 | 1L << (uVar6 & 0x3f);
      uVar6 = uVar6 + 1;
    }
    RANK_MASK[lVar5] = uVar13;
    uVar11 = uVar11 + 8;
  }
  uVar11 = 7;
  uVar6 = 9;
  for (uVar12 = 0; uVar8 = uVar12, uVar12 != 0x40; uVar12 = uVar12 + 1) {
    for (; uVar7 = uVar12, uVar8 < 0x38; uVar8 = uVar8 + 8) {
      PASSED_PAWN_MASK[0][uVar12] = PASSED_PAWN_MASK[0][uVar12] | 0x100L << ((byte)uVar8 & 0x3f);
    }
    while (7 < (long)uVar7) {
      PASSED_PAWN_MASK[1][uVar12] = PASSED_PAWN_MASK[1][uVar12] | 1L << ((byte)(uVar7 - 8) & 0x3f);
      uVar7 = uVar7 - 8;
    }
    if ((0xfefefefefefefefeU >> (uVar12 & 0x3f) & 1) != 0) {
      ISOLATED_PAWN_MASK[uVar12] = ISOLATED_PAWN_MASK[uVar12] | FILE_MASK[FILES[uVar12] - 1];
      for (uVar8 = uVar11; uVar8 < 0x40; uVar8 = uVar8 + 8) {
        PASSED_PAWN_MASK[0][uVar12] = PASSED_PAWN_MASK[0][uVar12] | 1L << ((byte)uVar8 & 0x3f);
      }
      for (iVar4 = (int)uVar12 + -9; -1 < iVar4; iVar4 = iVar4 + -8) {
        PASSED_PAWN_MASK[1][uVar12] = PASSED_PAWN_MASK[1][uVar12] | 1L << ((byte)iVar4 & 0x3f);
      }
    }
    if ((0x7f7f7f7f7f7f7f7fU >> (uVar12 & 0x3f) & 1) != 0) {
      ISOLATED_PAWN_MASK[uVar12] = ISOLATED_PAWN_MASK[uVar12] | FILE_MASK[(long)FILES[uVar12] + 1];
      for (uVar8 = uVar6; uVar8 < 0x40; uVar8 = uVar8 + 8) {
        PASSED_PAWN_MASK[0][uVar12] = PASSED_PAWN_MASK[0][uVar12] | 1L << ((byte)uVar8 & 0x3f);
      }
      for (iVar4 = (int)uVar12 + -9; -1 < iVar4; iVar4 = iVar4 + -8) {
        PASSED_PAWN_MASK[1][uVar12] = PASSED_PAWN_MASK[1][uVar12] | 1L << ((byte)iVar4 & 0x3f);
      }
    }
    uVar11 = uVar11 + 1;
    uVar6 = uVar6 + 1;
  }
  std::random_device::~random_device(&rd);
  return;
}

Assistant:

void board::Board::INIT()
{
    // Zobrist hash keys
    std::random_device rd;
    std::mt19937_64 e2(rd());
    std::uniform_int_distribution<uint64_t> dist(std::llround(std::pow(2, 61)), std::llround(std::pow(2, 62)));
    for (auto& i : PIECE_KEYS) {
        for (auto& j : i) {
            j = dist(e2);
        }
    }
    std::fill(std::begin(CASTLE_KEYS), std::end(CASTLE_KEYS), dist(e2));
    SIDE_KEY = dist(e2);
    // Bitmasks
    int square;
    int tSquare;
    for (int i = 0; i < 8; i++) {
        FILE_MASK[i] = 0ULL;
        RANK_MASK[i] = 0ULL;
    }
    for (int i = 0; i < 64; i++) {
        PASSED_PAWN_MASK[0][i] = 0ULL;
        PASSED_PAWN_MASK[1][i] = 0ULL;
        ISOLATED_PAWN_MASK[i] = 0ULL;
    }
    for (int rank = RANK_1; rank <= RANK_8; rank++) {
        for (int file = FILE_A; file <= FILE_H; file++) {
            square = rank * 8 + file;
            FILE_MASK[file] |= (1ULL << square);
            RANK_MASK[rank] |= (1ULL << square);
        }
    }
    for (square = 0; square < 64; square++) {
        tSquare = square + 8;
        while (tSquare < 64) {
            PASSED_PAWN_MASK[WHITE][square] |= (1ULL << tSquare);
            tSquare += 8;
        }
        tSquare = square - 8;
        while (tSquare >= 0) {
            PASSED_PAWN_MASK[BLACK][square] |= (1ULL << tSquare);
            tSquare -= 8;
        }
        if (Board::FILES[square] > FILE_A) {
            ISOLATED_PAWN_MASK[square] |= FILE_MASK[Board::FILES[square] - 1];
            tSquare = square + 7;
            while (tSquare < 64) {
                PASSED_PAWN_MASK[WHITE][square] |= (1ULL << tSquare);
                tSquare += 8;
            }
            tSquare = square - 9;
            while (tSquare >= 0) {
                PASSED_PAWN_MASK[BLACK][square] |= (1ULL << tSquare);
                tSquare -= 8;
            }
        }
        if (Board::FILES[square] < FILE_H) {
            ISOLATED_PAWN_MASK[square] |= FILE_MASK[Board::FILES[square] + 1];
            tSquare = square + 9;
            while (tSquare < 64) {
                PASSED_PAWN_MASK[WHITE][square] |= (1ULL << tSquare);
                tSquare += 8;
            }
            tSquare = square - 9;
            while (tSquare >= 0) {
                PASSED_PAWN_MASK[BLACK][square] |= (1ULL << tSquare);
                tSquare -= 8;
            }
        }
    }
}